

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

ClippedEdge *
MutableS2ShapeIndex::ClipUBound(ClippedEdge *edge,int u_end,double u,EdgeAllocator *alloc)

{
  FaceEdge *pFVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ClippedEdge *pCVar5;
  double dVar6;
  S2LogMessage local_30;
  
  if (u_end == 0) {
    if (u <= (edge->bound).bounds_[0].bounds_.c_[0]) {
      return edge;
    }
  }
  else if ((edge->bound).bounds_[0].bounds_.c_[1] <= u) {
    return edge;
  }
  pFVar1 = edge->face_edge;
  dVar2 = (pFVar1->a).c_[0];
  dVar3 = (pFVar1->a).c_[1];
  dVar4 = (pFVar1->b).c_[0];
  dVar6 = (pFVar1->b).c_[1];
  if ((dVar2 == dVar4) && (!NAN(dVar2) && !NAN(dVar4))) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_clipping.h"
               ,0xab,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: (a) != (b) ",0x19);
    abort();
  }
  if (ABS(dVar2 - u) <= ABS(dVar4 - u)) {
    dVar6 = dVar3 + ((dVar6 - dVar3) * (u - dVar2)) / (dVar4 - dVar2);
  }
  else {
    dVar6 = dVar6 + ((dVar3 - dVar6) * (u - dVar4)) / (dVar2 - dVar4);
  }
  dVar6 = R1Interval::Project((edge->bound).bounds_ + 1,dVar6);
  pCVar5 = UpdateBound(edge,u_end,u,
                       -(uint)((pFVar1->b).c_[0] < (pFVar1->a).c_[0] !=
                              (pFVar1->b).c_[1] < (pFVar1->a).c_[1]) & 1 ^ u_end,dVar6,alloc);
  return pCVar5;
}

Assistant:

const MutableS2ShapeIndex::ClippedEdge*
MutableS2ShapeIndex::ClipUBound(const ClippedEdge* edge, int u_end, double u,
                                EdgeAllocator* alloc) {
  // First check whether the edge actually requires any clipping.  (Sometimes
  // this method is called when clipping is not necessary, e.g. when one edge
  // endpoint is in the overlap area between two padded child cells.)
  if (u_end == 0) {
    if (edge->bound[0].lo() >= u) return edge;
  } else {
    if (edge->bound[0].hi() <= u) return edge;
  }
  // We interpolate the new v-value from the endpoints of the original edge.
  // This has two advantages: (1) we don't need to store the clipped endpoints
  // at all, just their bounding box; and (2) it avoids the accumulation of
  // roundoff errors due to repeated interpolations.  The result needs to be
  // clamped to ensure that it is in the appropriate range.
  const FaceEdge& e = *edge->face_edge;
  double v = edge->bound[1].Project(
      S2::InterpolateDouble(u, e.a[0], e.b[0], e.a[1], e.b[1]));

  // Determine which endpoint of the v-axis bound to update.  If the edge
  // slope is positive we update the same endpoint, otherwise we update the
  // opposite endpoint.
  int v_end = u_end ^ ((e.a[0] > e.b[0]) != (e.a[1] > e.b[1]));
  return UpdateBound(edge, u_end, u, v_end, v, alloc);
}